

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpub.c
# Opt level: O2

int nn_xpub_add(nn_sockbase *self,nn_pipe *pipe)

{
  nn_dist_data *data;
  
  data = (nn_dist_data *)nn_alloc_(0x18);
  if (data != (nn_dist_data *)0x0) {
    nn_dist_add((nn_dist *)(self + 1),data,pipe);
    nn_pipe_setdata(pipe,data);
    return 0;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/pubsub/xpub.c"
          ,0x6e);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_xpub_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xpub *xpub;
    struct nn_xpub_data *data;

    xpub = nn_cont (self, struct nn_xpub, sockbase);

    data = nn_alloc (sizeof (struct nn_xpub_data), "pipe data (pub)");
    alloc_assert (data);
    nn_dist_add (&xpub->outpipes, &data->item, pipe);
    nn_pipe_setdata (pipe, data);

    return 0;
}